

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::Fixed>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 Fixed min,Fixed max,float gridSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fixed FVar5;
  Fixed FVar6;
  char *pcVar7;
  Fixed min_00;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  deRandom rnd;
  
  uVar19 = (ulong)(uint)stride;
  iVar1 = componentCount * 4;
  if (stride != 0) {
    iVar1 = stride;
  }
  iVar2 = iVar1 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar2 = 0;
  }
  pcVar7 = (char *)operator_new__((long)(iVar2 * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar25 = (float)max.m_value - (float)min.m_value;
    uVar23 = -(uint)(-fVar25 <= fVar25);
    iVar3 = (int)((float)(~uVar23 & (uint)-fVar25 | (uint)fVar25 & uVar23) * gridSize * 32768.0);
    min_00.m_value = 0x800;
    if (0x800 < iVar3) {
      min_00.m_value = iVar3;
    }
    iVar8 = iVar1 * 4;
    iVar3 = iVar1 * 5;
    uVar20 = 0;
    uVar21 = (ulong)(uint)count;
    if (count < 1) {
      uVar21 = 0;
    }
    iVar16 = 8;
    iVar17 = 0xc;
    iVar15 = 1;
    iVar12 = iVar8;
    iVar11 = iVar3;
    iVar10 = iVar3;
    iVar9 = iVar3;
    for (; uVar20 != uVar21; uVar20 = uVar20 + 1) {
      iVar4 = 4;
      do {
        uVar23 = (uint)uVar19;
        bVar22 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar22) break;
        FVar5 = getRandom<deqp::gls::GLValue::Fixed>(&rnd,min,max);
        iVar9 = FVar5.m_value - FVar5.m_value % min_00.m_value;
        FVar5 = getRandom<deqp::gls::GLValue::Fixed>
                          (&rnd,min_00,(Fixed)(max.m_value - iVar9 & 0x7fff));
        iVar15 = FVar5.m_value - FVar5.m_value % min_00.m_value;
        FVar5 = getRandom<deqp::gls::GLValue::Fixed>(&rnd,min,max);
        iVar10 = FVar5.m_value - FVar5.m_value % min_00.m_value;
        FVar5 = getRandom<deqp::gls::GLValue::Fixed>
                          (&rnd,min_00,(Fixed)(max.m_value - iVar10 & 0x7fff));
        iVar11 = FVar5.m_value - FVar5.m_value % min_00.m_value;
        if (componentCount < 3) {
          uVar23 = 0;
          iVar12 = 1;
          break;
        }
        FVar5 = getRandom<deqp::gls::GLValue::Fixed>(&rnd,min,max);
        iVar12 = 1;
        if (componentCount != 3) {
          FVar6 = getRandom<deqp::gls::GLValue::Fixed>(&rnd,min,max);
          iVar12 = FVar6.m_value - FVar6.m_value % min_00.m_value;
        }
        uVar23 = FVar5.m_value - FVar5.m_value % min_00.m_value;
        uVar19 = (ulong)uVar23;
        fVar25 = (float)(int)uVar23 + (float)iVar15;
        uVar24 = -(uint)(-fVar25 <= fVar25);
      } while (((float)(~uVar24 & (uint)-fVar25 | (uint)fVar25 & uVar24) < (float)min_00.m_value) ||
              (fVar25 = (float)iVar12 + (float)iVar11, uVar24 = -(uint)(-fVar25 <= fVar25),
              (float)(~uVar24 & (uint)-fVar25 | (uint)fVar25 & uVar24) < (float)min_00.m_value));
      iVar4 = iVar2 * (int)uVar20;
      iVar13 = iVar9 + iVar15;
      *(int *)(pcVar7 + (long)iVar4 + (long)offset) = iVar9;
      *(int *)(pcVar7 + (long)(iVar4 + 4) + (long)offset) = iVar10;
      *(int *)(pcVar7 + (long)(iVar4 + iVar1) + (long)offset) = iVar13;
      *(int *)(pcVar7 + (long)(iVar4 + 4 + iVar1) + (long)offset) = iVar10;
      iVar18 = iVar10 + iVar11;
      *(int *)(pcVar7 + (long)(iVar4 + iVar1 * 2) + (long)offset) = iVar9;
      *(int *)(pcVar7 + (long)(iVar4 + 4 + iVar1 * 2) + (long)offset) = iVar18;
      *(int *)(pcVar7 + (long)(iVar4 + iVar1 * 3) + (long)offset) = iVar9;
      *(int *)(pcVar7 + (long)(iVar4 + 4 + iVar1 * 3) + (long)offset) = iVar18;
      *(int *)(pcVar7 + (long)(iVar4 + iVar8) + (long)offset) = iVar13;
      *(int *)(pcVar7 + (long)(iVar4 + 4 + iVar8) + (long)offset) = iVar10;
      *(int *)(pcVar7 + (long)(iVar4 + iVar3) + (long)offset) = iVar13;
      *(int *)(pcVar7 + (long)(iVar4 + 4 + iVar3) + (long)offset) = iVar18;
      uVar19 = (ulong)uVar23;
      if (2 < componentCount) {
        lVar14 = 6;
        iVar4 = iVar16;
        while (bVar22 = lVar14 != 0, lVar14 = lVar14 + -1, bVar22) {
          *(uint *)(pcVar7 + (long)iVar4 + (long)offset) = uVar23;
          iVar4 = iVar4 + iVar1;
        }
        if (componentCount != 3) {
          lVar14 = 6;
          iVar4 = iVar17;
          while (bVar22 = lVar14 != 0, lVar14 = lVar14 + -1, bVar22) {
            *(int *)(pcVar7 + (long)iVar4 + (long)offset) = iVar12;
            iVar4 = iVar4 + iVar1;
          }
        }
      }
      iVar16 = iVar16 + iVar2;
      iVar17 = iVar17 + iVar2;
    }
  }
  return pcVar7;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}